

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O0

bool ON_SubDQuadNeighborhood::GetSubdivisionPoint(ON_SubDEdge *edge,double *subdivision_point)

{
  bool bVar1;
  double local_38;
  double Q [3];
  double *subdivision_point_local;
  ON_SubDEdge *edge_local;
  
  Q[2] = (double)subdivision_point;
  if (subdivision_point == (double *)0x0) {
    ON_SubDIncrementErrorCount();
  }
  else {
    while ((edge != (ON_SubDEdge *)0x0 &&
           (bVar1 = ON_SubDEdge::GetSubdivisionPoint(edge,&local_38), bVar1))) {
      *(double *)Q[2] = local_38;
      *(double *)((long)Q[2] + 8) = Q[0];
      *(double *)((long)Q[2] + 0x10) = Q[1];
    }
    *(undefined8 *)Q[2] = 0xffe5f8bd9e331dd2;
    *(undefined8 *)((long)Q[2] + 8) = 0xffe5f8bd9e331dd2;
    *(undefined8 *)((long)Q[2] + 0x10) = 0xffe5f8bd9e331dd2;
    ON_SubDIncrementErrorCount();
  }
  return false;
}

Assistant:

bool ON_SubDQuadNeighborhood::GetSubdivisionPoint(
  const ON_SubDEdge* edge,
  double subdivision_point[3]
  )
{
  if (nullptr == subdivision_point)
    return ON_SUBD_RETURN_ERROR(false);
  for (;;)
  {
    if (nullptr==edge)
      break;
    double Q[3];
    if (!edge->GetSubdivisionPoint(Q))
      break;
    subdivision_point[0] = Q[0];
    subdivision_point[1] = Q[1];
    subdivision_point[2] = Q[2];
  }
  subdivision_point[0] = ON_UNSET_VALUE;
  subdivision_point[1] = ON_UNSET_VALUE;
  subdivision_point[2] = ON_UNSET_VALUE;
  return ON_SUBD_RETURN_ERROR(false);
}